

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printS8ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  char cVar2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  int8_t Value;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  cVar2 = (char)iVar3;
  if (cVar2 < '\0') {
    if (cVar2 < -9) {
      SStream_concat(in_RDX,"-0x%x",(ulong)(uint)-(int)cVar2);
    }
    else {
      SStream_concat(in_RDX,"-%u",(ulong)(uint)-(int)cVar2);
    }
  }
  else if (cVar2 < '\n') {
    SStream_concat(in_RDX,"%u",(ulong)(uint)(int)cVar2);
  }
  else {
    SStream_concat(in_RDX,"0x%x",(ulong)(uint)(int)cVar2);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar4[0] = '\x02';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    *(long *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) = (long)cVar2;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printS8ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	int8_t Value = (int8_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isInt<8>(Value) && "Invalid s8imm argument");

	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", Value);
		else
			SStream_concat(O, "%u", Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%x", -Value);
		else
			SStream_concat(O, "-%u", -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}